

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# splay.c
# Opt level: O1

Curl_tree * Curl_splay(curltime i,Curl_tree *t)

{
  int iVar1;
  long lVar2;
  Curl_tree *pCVar3;
  bool bVar4;
  Curl_tree *pCVar5;
  Curl_tree *pCVar6;
  Curl_tree *pCVar7;
  int iVar8;
  long lVar9;
  ulong uVar10;
  Curl_tree N;
  
  lVar9 = i.tv_sec;
  if (t == (Curl_tree *)0x0) {
    return (Curl_tree *)0x0;
  }
  pCVar6 = &N;
  N.smaller = (Curl_tree *)0x0;
  N.larger = (Curl_tree *)0x0;
  pCVar7 = pCVar6;
  do {
    uVar10 = 0xffffffffffffffff;
    lVar2 = (t->key).tv_sec;
    iVar8 = i.tv_usec;
    if ((lVar2 <= lVar9) && (uVar10 = 1, lVar9 <= lVar2)) {
      uVar10 = 0xffffffffffffffff;
      iVar1 = (t->key).tv_usec;
      if (iVar1 <= iVar8) {
        uVar10 = (ulong)(iVar1 < iVar8);
      }
    }
    if ((long)uVar10 < 0) {
      pCVar3 = t->smaller;
      if (pCVar3 == (Curl_tree *)0x0) goto LAB_0010e6de;
      lVar2 = (pCVar3->key).tv_sec;
      if ((lVar9 < lVar2) || ((lVar9 <= lVar2 && (iVar8 < (pCVar3->key).tv_usec)))) {
        t->smaller = pCVar3->larger;
        pCVar3->larger = t;
        t = pCVar3;
        if (pCVar3->smaller == (Curl_tree *)0x0) goto LAB_0010e702;
      }
      pCVar7->smaller = t;
      pCVar7 = t;
LAB_0010e6f1:
      t = t->smaller;
      bVar4 = true;
    }
    else {
      if ((uVar10 != 0) && (pCVar3 = t->larger, pCVar3 != (Curl_tree *)0x0)) {
        lVar2 = (pCVar3->key).tv_sec;
        pCVar5 = t;
        if ((lVar2 <= lVar9) && ((lVar2 < lVar9 || ((pCVar3->key).tv_usec < iVar8)))) {
          t->larger = pCVar3->smaller;
          pCVar3->smaller = t;
          pCVar5 = pCVar3;
          t = pCVar3;
          if (pCVar3->larger == (Curl_tree *)0x0) {
LAB_0010e702:
            bVar4 = false;
            goto LAB_0010e6f7;
          }
        }
        pCVar6->larger = pCVar5;
        t = (Curl_tree *)&pCVar5->larger;
        pCVar6 = pCVar5;
        goto LAB_0010e6f1;
      }
LAB_0010e6de:
      bVar4 = false;
    }
LAB_0010e6f7:
    if (!bVar4) {
      pCVar6->larger = t->smaller;
      pCVar7->smaller = t->larger;
      t->smaller = N.larger;
      t->larger = N.smaller;
      return t;
    }
  } while( true );
}

Assistant:

struct Curl_tree *Curl_splay(struct curltime i,
                             struct Curl_tree *t)
{
  struct Curl_tree N, *l, *r, *y;

  if(t == NULL)
    return t;
  N.smaller = N.larger = NULL;
  l = r = &N;

  for(;;) {
    long comp = compare(i, t->key);
    if(comp < 0) {
      if(t->smaller == NULL)
        break;
      if(compare(i, t->smaller->key) < 0) {
        y = t->smaller;                           /* rotate smaller */
        t->smaller = y->larger;
        y->larger = t;
        t = y;
        if(t->smaller == NULL)
          break;
      }
      r->smaller = t;                               /* link smaller */
      r = t;
      t = t->smaller;
    }
    else if(comp > 0) {
      if(t->larger == NULL)
        break;
      if(compare(i, t->larger->key) > 0) {
        y = t->larger;                          /* rotate larger */
        t->larger = y->smaller;
        y->smaller = t;
        t = y;
        if(t->larger == NULL)
          break;
      }
      l->larger = t;                              /* link larger */
      l = t;
      t = t->larger;
    }
    else
      break;
  }

  l->larger = t->smaller;                                /* assemble */
  r->smaller = t->larger;
  t->smaller = N.larger;
  t->larger = N.smaller;

  return t;
}